

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O2

char * inputSeq(void)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  int i;
  long lVar7;
  int iVar8;
  int i_1;
  undefined8 uStack_350;
  char local_348 [8];
  char buffer [256];
  long local_240;
  ifstream inFile;
  byte abStack_220 [488];
  char *local_38;
  
  uStack_350 = 0x102724;
  std::ifstream::ifstream(&local_240);
  uStack_350 = 0x10273a;
  pcVar2 = catStrStr(inputAddress,"seq.txt");
  uStack_350 = 0x10274c;
  openFile(pcVar2,(ifstream *)&local_240);
  uStack_350 = 0xfffffffffffffffe;
  lVar6 = -2;
  while ((abStack_220[*(long *)(local_240 + -0x18)] & 2) == 0) {
    uStack_350 = 0x102783;
    std::istream::getline((char *)&local_240,(long)local_348);
    lVar6 = lVar6 + 1;
  }
  uStack_350 = 0x102794;
  std::ifstream::close();
  uStack_350 = 0x1027a3;
  openFile(pcVar2,(ifstream *)&local_240);
  uVar3 = lVar6 + 1U & 0xffffffff;
  pcVar5 = local_348 + uVar3 * -0x100;
  local_38 = local_348;
  (&uStack_350)[uVar3 * -0x20] = 0x1027d3;
  std::istream::getline((char *)&local_240,(long)local_348);
  iVar8 = 0;
  pcVar2 = pcVar5;
  for (lVar7 = 0; lVar7 < lVar6; lVar7 = lVar7 + 1) {
    (&uStack_350)[uVar3 * -0x20] = 0x1027f5;
    std::istream::getline((char *)&local_240,(long)pcVar2);
    (&uStack_350)[uVar3 * -0x20] = 0x1027fd;
    sVar4 = strlen(pcVar2);
    iVar8 = iVar8 + (int)sVar4;
    pcVar2 = pcVar2 + 0x100;
  }
  (&uStack_350)[uVar3 * -0x20] = 0xffffffffffffffff;
  iVar1 = (int)(&uStack_350)[uVar3 * -0x20];
  if (-1 < iVar8) {
    iVar1 = iVar8;
  }
  (&uStack_350)[uVar3 * -0x20] = 0x10281e;
  pcVar2 = (char *)operator_new__((long)iVar1);
  *pcVar2 = '\0';
  for (lVar7 = 0; lVar7 < lVar6; lVar7 = lVar7 + 1) {
    (&uStack_350)[uVar3 * -0x20] = 0x102837;
    strcat(pcVar2,pcVar5);
    pcVar5 = pcVar5 + 0x100;
  }
  (&uStack_350)[uVar3 * -0x20] = 0x10284f;
  std::ifstream::close();
  pcVar5 = local_38;
  builtin_strncpy(local_38 + -8,"_(\x10",4);
  pcVar5[-4] = '\0';
  pcVar5[-3] = '\0';
  pcVar5[-2] = '\0';
  pcVar5[-1] = '\0';
  std::ifstream::~ifstream(&local_240);
  return pcVar2;
}

Assistant:

char * inputSeq(){
    // read in the sequence
    char *seq;
    char buffer[256];
    char *filename;
    ifstream inFile;
    filename = catStrStr(inputAddress,"seq.txt");
    openFile(filename, inFile);
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    inFile.close();

    openFile(filename, inFile);
    char tmp[cntLines][256];
    int len=0;
    inFile.getline(buffer, 256);                    //  the first line is not needed
    for (int i=0; i<cntLines-1; i++) {
        inFile.getline(tmp[i], 256);
        len += strlen(tmp[i]);
    }

    seq = new char [len];
    strcpy(seq, "");
    for (int i=0; i<cntLines-1; i++)  strcat(seq, tmp[i]);
    inFile.close();
    return seq;

}